

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

bool __thiscall Minisat::StringOption::parse(StringOption *this,char *str)

{
  bool bVar1;
  string *this_00;
  char *in_RSI;
  long in_RDI;
  char *span;
  allocator local_59;
  string local_58 [35];
  undefined1 local_35;
  allocator local_21;
  char *local_20 [3];
  bool local_1;
  
  local_20[0] = in_RSI;
  bVar1 = match<char_const*>(local_20,"-");
  if (((bVar1) && (bVar1 = match<char_const*>(local_20,*(char **)(in_RDI + 8)), bVar1)) &&
     (bVar1 = match<char_const*>(local_20,"="), bVar1)) {
    if (*(long *)(in_RDI + 0x30) == 0) {
      this_00 = (string *)operator_new(0x20);
      local_35 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this_00,local_20[0],&local_21);
      local_35 = 0;
      *(string **)(in_RDI + 0x30) = this_00;
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,local_20[0],&local_59);
      std::__cxx11::string::operator=(*(string **)(in_RDI + 0x30),local_58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

virtual bool parse(const char *str)
    {
        const char *span = str;

        if (!match(span, "-") || !match(span, name) || !match(span, "=")) return false;

        if (value == NULL) {
            value = new std::string(span);
        } else {
            *value = std::string(span);
        }
        return true;
    }